

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O1

ze_result_t
zetGetMetricDecoderExpProcAddrTable
          (ze_api_version_t version,zet_metric_decoder_exp_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  zet_pfnMetricDecoderDestroyExp_t p_Var3;
  ze_result_t zVar4;
  code *UNRECOVERED_JUMPTABLE;
  iterator __begin1;
  undefined8 *puVar5;
  
  puVar5 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  zVar4 = ZE_RESULT_ERROR_UNINITIALIZED;
  if (puVar1 != puVar5) {
    if (pDdiTable == (zet_metric_decoder_exp_dditable_t *)0x0) {
      zVar4 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    else {
      zVar4 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
      if ((int)version <= *(int *)(loader::context + 0x15c0)) {
        zVar4 = ZE_RESULT_SUCCESS;
        for (; puVar5 != puVar1; puVar5 = puVar5 + 0x1b3) {
          if ((*(int *)(puVar5 + 1) == 0) &&
             (UNRECOVERED_JUMPTABLE = (code *)dlsym(*puVar5,"zetGetMetricDecoderExpProcAddrTable"),
             UNRECOVERED_JUMPTABLE != (code *)0x0)) {
            zVar4 = (*UNRECOVERED_JUMPTABLE)(version,puVar5 + 0xd8);
          }
        }
        if (zVar4 == ZE_RESULT_SUCCESS) {
          lVar2 = *(long *)(loader::context + 0x15e0);
          if (((ulong)((*(long *)(loader::context + 0x15e8) - lVar2 >> 3) * 0x7aff6957aff6957b) < 2)
             && (*(char *)(loader::context + 0x1629) != '\x01')) {
            pDdiTable->pfnGetDecodableMetricsExp =
                 *(zet_pfnMetricDecoderGetDecodableMetricsExp_t *)(lVar2 + 0x6d0);
            p_Var3 = *(zet_pfnMetricDecoderDestroyExp_t *)(lVar2 + 0x6c8);
            pDdiTable->pfnCreateExp = *(zet_pfnMetricDecoderCreateExp_t *)(lVar2 + 0x6c0);
            pDdiTable->pfnDestroyExp = p_Var3;
          }
          else {
            pDdiTable->pfnCreateExp = loader::zetMetricDecoderCreateExp;
            pDdiTable->pfnDestroyExp = loader::zetMetricDecoderDestroyExp;
            pDdiTable->pfnGetDecodableMetricsExp = loader::zetMetricDecoderGetDecodableMetricsExp;
          }
          if (*(long *)(loader::context + 0x1618) == 0) {
            zVar4 = ZE_RESULT_SUCCESS;
          }
          else {
            UNRECOVERED_JUMPTABLE =
                 (code *)dlsym(*(long *)(loader::context + 0x1618),
                               "zetGetMetricDecoderExpProcAddrTable");
            zVar4 = ZE_RESULT_ERROR_UNINITIALIZED;
            if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
              zVar4 = (*UNRECOVERED_JUMPTABLE)(version,pDdiTable);
              return zVar4;
            }
          }
        }
      }
    }
  }
  return zVar4;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zetGetMetricDecoderExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    zet_metric_decoder_exp_dditable_t* pDdiTable    ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<zet_pfnGetMetricDecoderExpProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zetGetMetricDecoderExpProcAddrTable") );
        if(!getTable) 
            continue; 
        result = getTable( version, &drv.dditable.zet.MetricDecoderExp);
    }


    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnCreateExp                                = loader::zetMetricDecoderCreateExp;
            pDdiTable->pfnDestroyExp                               = loader::zetMetricDecoderDestroyExp;
            pDdiTable->pfnGetDecodableMetricsExp                   = loader::zetMetricDecoderGetDecodableMetricsExp;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.zet.MetricDecoderExp;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<zet_pfnGetMetricDecoderExpProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zetGetMetricDecoderExpProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    return result;
}